

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SQLiteBuildDB.cpp
# Opt level: O3

bool __thiscall
anon_unknown.dwarf_4da258::SQLiteBuildDB::setCurrentIteration
          (SQLiteBuildDB *this,uint64_t value,string *error_out)

{
  int iVar1;
  int __oflag;
  bool bVar2;
  sqlite3_stmt *stmt;
  undefined8 local_50;
  string local_48;
  
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)&this->dbMutex);
  if (iVar1 != 0) {
    std::__throw_system_error(iVar1);
  }
  iVar1 = open(this,(char *)error_out,__oflag);
  if ((char)iVar1 != '\0') {
    iVar1 = sqlite3_prepare_v2(this->db,"UPDATE info SET iteration = ? WHERE id == 0;",0xffffffff,
                               &local_50,0);
    if (iVar1 == 0) {
      iVar1 = sqlite3_bind_int64(local_50,1,value);
      if (iVar1 == 0) {
        iVar1 = sqlite3_step(local_50);
        if (iVar1 == 0x65) {
          sqlite3_finalize(local_50);
          bVar2 = true;
          goto LAB_001bb0b3;
        }
        (anonymous_namespace)::SQLiteBuildDB::getCurrentErrorMessage_abi_cxx11_(&local_48,this);
        std::__cxx11::string::operator=((string *)error_out,(string *)&local_48);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_48._M_dataplus._M_p != &local_48.field_2) {
          operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
        }
        sqlite3_finalize(local_50);
        goto LAB_001bb0b1;
      }
    }
    (anonymous_namespace)::SQLiteBuildDB::getCurrentErrorMessage_abi_cxx11_(&local_48,this);
    std::__cxx11::string::operator=((string *)error_out,(string *)&local_48);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
  }
LAB_001bb0b1:
  bVar2 = false;
LAB_001bb0b3:
  pthread_mutex_unlock((pthread_mutex_t *)&this->dbMutex);
  return bVar2;
}

Assistant:

virtual bool setCurrentIteration(uint64_t value, std::string *error_out) override {
    std::lock_guard<std::mutex> guard(dbMutex);

    if (!open(error_out)) {
      return false;
    }

    sqlite3_stmt* stmt;
    int result;
    result = sqlite3_prepare_v2(
      db, "UPDATE info SET iteration = ? WHERE id == 0;",
      -1, &stmt, nullptr);
    checkSQLiteResultOKReturnFalse(result);
    result = sqlite3_bind_int64(stmt, /*index=*/1, value);
    checkSQLiteResultOKReturnFalse(result);

    result = sqlite3_step(stmt);
    if (result != SQLITE_DONE) {
      *error_out = getCurrentErrorMessage();
      sqlite3_finalize(stmt);
      return false;
    }

    sqlite3_finalize(stmt);
    return true;
  }